

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall
mkvparser::SimpleBlock::SimpleBlock
          (SimpleBlock *this,Cluster *pCluster,long idx,longlong start,longlong size)

{
  (this->super_BlockEntry).m_pCluster = pCluster;
  (this->super_BlockEntry).m_index = idx;
  (this->super_BlockEntry)._vptr_BlockEntry = (_func_int **)&PTR__SimpleBlock_00120c48;
  (this->m_block).m_start = start;
  (this->m_block).m_size = size;
  (this->m_block).m_track = 0;
  (this->m_block).m_timecode = -1;
  (this->m_block).m_flags = '\0';
  (this->m_block).m_frames = (Frame *)0x0;
  (this->m_block).m_frame_count = -1;
  (this->m_block).m_discard_padding = 0;
  return;
}

Assistant:

BlockEntry::BlockEntry(Cluster* p, long idx) : m_pCluster(p), m_index(idx) {}